

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<double>::Decompose_Cholesky_blk(TPZSkylMatrix<double> *this,int64_t blk_sz)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  int64_t iVar6;
  double **ppdVar7;
  double *pdVar8;
  ostream *this_00;
  void *this_01;
  long in_RSI;
  long *in_RDI;
  double dVar9;
  double *end_k;
  double *elem_k;
  double *u_jj;
  double sum_1;
  uint l;
  uint tmp;
  uint max_l;
  double *end_ki;
  double *elem_ki;
  double *end_kj;
  double *elem_kj;
  double sum;
  double *u_ij;
  int64_t I;
  int64_t i;
  int64_t last_i;
  int64_t first_i;
  int64_t j;
  int64_t last_row;
  int64_t first_col;
  int64_t first_row;
  int64_t blk_i;
  int64_t dimension;
  double minpivot;
  double pivot;
  double local_120;
  long in_stack_fffffffffffffee8;
  long lVar10;
  TPZSkylMatrix<double> *in_stack_fffffffffffffef0;
  long local_108;
  long local_f0;
  double *local_d0;
  double local_c0;
  uint local_b4;
  uint local_ac;
  double *local_a0;
  double *local_90;
  double local_88;
  long local_70;
  long local_58;
  long local_38;
  double local_28;
  double local_20;
  
  if ((char)in_RDI[3] != '\x03') {
    if ((char)in_RDI[3] != '\0') {
      TPZMatrix<double>::Error((char *)first_col,(char *)last_row);
    }
    local_20 = 0.0;
    local_28 = 10000.0;
    lVar5 = (**(code **)(*in_RDI + 0x60))();
    for (local_38 = 0; local_38 < lVar5; local_38 = in_RSI + local_38) {
      local_f0 = lVar5;
      if (local_38 + in_RSI <= lVar5) {
        local_f0 = local_38 + in_RSI;
      }
      for (local_58 = local_38; local_58 < lVar5; local_58 = local_58 + 1) {
        iVar6 = Size(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        if (iVar6 == 0) {
          return 0;
        }
        iVar6 = Size(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        if ((local_58 + 1) - iVar6 < local_38) {
          local_108 = local_38;
        }
        else {
          in_stack_fffffffffffffef0 = (TPZSkylMatrix<double> *)(local_58 + 1);
          iVar6 = Size(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          local_108 = (long)in_stack_fffffffffffffef0 - iVar6;
        }
        lVar10 = local_58;
        if (local_38 + local_f0 < local_58) {
          lVar10 = local_38 + local_f0;
        }
        in_stack_fffffffffffffee8 = lVar10;
        for (local_70 = local_108; local_70 < lVar10; local_70 = local_70 + 1) {
          ppdVar7 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_58);
          pdVar8 = *ppdVar7 + (local_58 - local_70);
          ppdVar7 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_58 + 1);
          pdVar1 = *ppdVar7;
          ppdVar7 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_70);
          pdVar2 = *ppdVar7;
          ppdVar7 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_70 + 1);
          local_88 = 0.0;
          local_ac = (uint)((long)pdVar1 - (long)(pdVar8 + 1) >> 3);
          uVar4 = (uint)((long)*ppdVar7 - (long)(pdVar2 + 1) >> 3);
          if (uVar4 < local_ac) {
            local_ac = uVar4;
          }
          local_a0 = pdVar2 + 1;
          local_90 = pdVar8 + 1;
          for (local_b4 = 0; local_b4 < local_ac; local_b4 = local_b4 + 1) {
            local_88 = *local_90 * *local_a0 + local_88;
            local_a0 = local_a0 + 1;
            local_90 = local_90 + 1;
          }
          *pdVar8 = (*pdVar8 - local_88) / local_20;
        }
        if (lVar10 == local_58) {
          local_c0 = 0.0;
          ppdVar7 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_58);
          pdVar1 = *ppdVar7;
          ppdVar7 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_58);
          local_d0 = *ppdVar7;
          ppdVar7 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_58 + 1);
          while (local_d0 = local_d0 + 1, local_d0 < *ppdVar7) {
            local_c0 = *local_d0 * *local_d0 + local_c0;
          }
          local_20 = *pdVar1 - local_c0;
          local_120 = local_20;
          if (local_28 < local_20) {
            local_120 = local_28;
          }
          local_28 = local_120;
          if ((local_20 < 0.0) || (bVar3 = IsZero(local_20), bVar3)) {
            this_00 = std::operator<<((ostream *)&std::cout,
                                      "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida"
                                     );
            this_01 = (void *)std::ostream::operator<<(this_00,local_20);
            std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
            return 0;
          }
          dVar9 = sqrt(local_20);
          *pdVar1 = dVar9;
        }
      }
    }
    *(undefined1 *)(in_RDI + 3) = 3;
    *(undefined1 *)((long)in_RDI + 0x19) = 1;
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky_blk(int64_t blk_sz)
{
    if(this->fDecomposed == ECholesky) 
        return 1;
    if (this->fDecomposed )  
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
    TVar pivot = (TVar)0.;
    TVar minpivot = 10000.;
    int64_t dimension = this->Dim();
    
    for (int64_t blk_i = 0; blk_i < dimension; blk_i += blk_sz) {
        int64_t first_row = blk_i;
        int64_t first_col = blk_i;
        int64_t last_row  = blk_i + MIN(dimension,blk_i+blk_sz);
        
        // Compute band inner nodes
        for ( int64_t j = first_col; j < dimension; j++) {
            
            if (Size(j) == 0)   
                return( 0 ); // Size of column cannot be zero.
            
            int64_t first_i = MAX(first_row, (j+1)-Size(j));
            int64_t last_i = MIN(last_row, j); // j-1 becase we do not need to compute u(j,j)
            for ( int64_t i = first_i; i < last_i; i++) {
                
                // Compute u(i,j) = (a_ij - SUM_k_1_to_i-1 (u_ki * u_kj) ) / uii 
                
                //	TVar  u_ii = fElem[i][0];
                int64_t I = j-i; // fElem[j][I] = A(i,j) I = j-i
                TVar* u_ij = &fElem[j][I];
                
                TVar sum = 0.0;
                TVar *elem_kj = u_ij+1;
                TVar *end_kj  = fElem[j+1];
                TVar *elem_ki = &fElem[i][1];
                TVar *end_ki  = fElem[i+1];
                
                // Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
                sum = 0.0;
                
                unsigned max_l = end_kj - elem_kj;
                unsigned tmp = end_ki - elem_ki;
                if (tmp < max_l) max_l = tmp;
#pragma clang loop vectorize_width(2)
                for(unsigned l=0; l<max_l; l++)
                    sum += (*elem_kj++) * (*elem_ki++);
                
                *u_ij = (*u_ij - sum) / pivot;
            } 
            
            // After computing all the elements of this column, compute the diagonal (ujj)
            if (last_i == j)
            {
                TVar sum = 0.0;
                TVar* u_jj = &fElem[j][0];
                TVar *elem_k = fElem[j]+1;
                TVar *end_k  = fElem[j+1];
#pragma clang loop vectorize_width(2)
                for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
                pivot = *u_jj - sum;
                
                minpivot = minpivot < pivot ? minpivot : pivot;
                
                if ( pivot < ((TVar)0.) || IsZero(pivot) ) {
                    cout << "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida" << pivot << endl;
                    return( 0 );
                }
                // Valor do elemento da diagonal k,k
                *u_jj = sqrt( pivot );
            }
        }
    }	
    this->fDecomposed  = ECholesky;
    this->fDefPositive = 1;
    return( 1 );
}